

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

void __thiscall
dg::vr::StructureAnalyzer::setValidAreasByInstruction
          (StructureAnalyzer *this,VRLocation *location,
          vector<bool,_std::allocator<bool>_> *validAreas,VRInstruction *vrinst)

{
  StringRef RHS;
  bool bVar1;
  ID IVar2;
  AllocationFunction AVar3;
  ret_type pCVar4;
  Function *pFVar5;
  CallBase *this_00;
  VRInstruction *in_RCX;
  long in_RSI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> pVar6;
  AnalysisOptions options;
  Function *function;
  CallInst *call;
  IntrinsicInst *intrinsic;
  AllocatedArea *area;
  uint index;
  Instruction *inst;
  uint in_stack_fffffffffffffe2c;
  StringRef *in_stack_fffffffffffffe30;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  AnalysisOptions *in_stack_fffffffffffffe48;
  StringRef *in_stack_fffffffffffffe58;
  Value *local_1a0;
  Value *ptr;
  StructureAnalyzer *in_stack_fffffffffffffe70;
  Value *in_stack_fffffffffffffeb0;
  reference in_stack_fffffffffffffeb8;
  string local_108 [24];
  AnalysisOptions *in_stack_ffffffffffffff10;
  reference local_a0 [2];
  uint local_80;
  AllocatedArea *local_78;
  ret_type local_70;
  reference local_68 [2];
  uint local_48;
  AllocatedArea *local_40;
  long local_38;
  undefined4 local_2c;
  Instruction *local_28;
  long local_10;
  
  local_10 = in_RSI;
  ptr = local_1a0;
  local_28 = VRInstruction::getInstruction(in_RCX);
  local_2c = 0;
  local_38 = 0;
  bVar1 = llvm::isa<llvm::AllocaInst,llvm::Instruction_const*>((Instruction **)0x1efa0d);
  if (bVar1) {
    pVar6 = getAllocatedAreaFor(in_stack_fffffffffffffe70,ptr);
    local_40 = pVar6.second;
    local_48 = pVar6.first;
    std::tie<unsigned_int,dg::vr::AllocatedArea_const*>
              (&in_stack_fffffffffffffe38->first,(AllocatedArea **)in_stack_fffffffffffffe30);
    std::tuple<unsigned_int&,dg::vr::AllocatedArea_const*&>::operator=
              ((tuple<unsigned_int_&,_const_dg::vr::AllocatedArea_*&> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38);
    local_68[0] = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (in_RDI,(size_type)in_stack_fffffffffffffe48);
    std::_Bit_reference::operator=(local_68,true);
  }
  local_70 = llvm::dyn_cast<llvm::IntrinsicInst,llvm::Instruction_const>
                       ((Instruction *)in_stack_fffffffffffffe30);
  if ((local_70 != (ret_type)0x0) &&
     (IVar2 = llvm::IntrinsicInst::getIntrinsicID((IntrinsicInst *)0x1efad2), IVar2 == 0xa4)) {
    in_stack_fffffffffffffe48 = (AnalysisOptions *)(local_10 + 8);
    llvm::CallBase::getOperand((CallBase *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    pVar6 = getEqualArea((StructureAnalyzer *)in_stack_fffffffffffffeb8._M_mask,
                         (ValueRelations *)in_stack_fffffffffffffeb8._M_p,in_stack_fffffffffffffeb0)
    ;
    local_78 = pVar6.second;
    local_80 = pVar6.first;
    std::tie<unsigned_int,dg::vr::AllocatedArea_const*>
              (&in_stack_fffffffffffffe38->first,(AllocatedArea **)in_stack_fffffffffffffe30);
    std::tuple<unsigned_int&,dg::vr::AllocatedArea_const*&>::operator=
              ((tuple<unsigned_int_&,_const_dg::vr::AllocatedArea_*&> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38);
    local_a0[0] = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (in_RDI,(size_type)in_stack_fffffffffffffe48);
    std::_Bit_reference::operator=(local_a0,false);
  }
  pCVar4 = llvm::dyn_cast<llvm::CallInst,llvm::Instruction_const>
                     ((Instruction *)in_stack_fffffffffffffe30);
  if ((pCVar4 != (ret_type)0x0) &&
     (pFVar5 = llvm::CallBase::getCalledFunction((CallBase *)in_stack_fffffffffffffe38),
     pFVar5 != (Function *)0x0)) {
    AnalysisOptions::AnalysisOptions(in_stack_ffffffffffffff10);
    llvm::Value::getName();
    llvm::StringRef::str_abi_cxx11_(in_stack_fffffffffffffe58);
    AVar3 = AnalysisOptions::getAllocationFunction
                      (in_stack_fffffffffffffe48,
                       (string *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    std::__cxx11::string::~string(local_108);
    if (AVar3 == REALLOC) {
      in_stack_fffffffffffffe38 =
           (pair<unsigned_int,_const_dg::vr::AllocatedArea_*> *)(local_10 + 8);
      llvm::CallBase::getOperand((CallBase *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      getEqualArea((StructureAnalyzer *)in_stack_fffffffffffffeb8._M_mask,
                   (ValueRelations *)in_stack_fffffffffffffeb8._M_p,in_stack_fffffffffffffeb0);
      std::tie<unsigned_int,dg::vr::AllocatedArea_const*>
                (&in_stack_fffffffffffffe38->first,(AllocatedArea **)in_stack_fffffffffffffe30);
      std::tuple<unsigned_int&,dg::vr::AllocatedArea_const*&>::operator=
                ((tuple<unsigned_int_&,_const_dg::vr::AllocatedArea_*&> *)
                 CONCAT44(AVar3,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38);
      if (local_38 == 0) {
        in_stack_fffffffffffffeb0 =
             llvm::CallBase::getOperand
                       ((CallBase *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        bVar1 = llvm::isa<llvm::ConstantPointerNull,llvm::Value*>((Value **)0x1efd1e);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          invalidateHeapAllocatedAreas
                    (in_stack_fffffffffffffe70,(vector<bool,_std::allocator<bool>_> *)ptr);
        }
      }
      else {
        in_stack_fffffffffffffeb8 =
             std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_RDI,(size_type)in_stack_fffffffffffffe48);
        std::_Bit_reference::operator=((_Bit_reference *)&stack0xfffffffffffffeb8,false);
      }
    }
    llvm::Value::getName();
    llvm::StringRef::StringRef
              ((StringRef *)CONCAT44(AVar3,in_stack_fffffffffffffe40),
               (char *)in_stack_fffffffffffffe38);
    RHS.Length._0_4_ = in_stack_fffffffffffffe40;
    RHS.Data = (char *)in_stack_fffffffffffffe38;
    RHS.Length._4_4_ = AVar3;
    bVar1 = llvm::StringRef::equals(in_stack_fffffffffffffe30,RHS);
    if (bVar1) {
      this_00 = (CallBase *)(local_10 + 8);
      llvm::CallBase::getOperand(this_00,in_stack_fffffffffffffe2c);
      getEqualArea((StructureAnalyzer *)in_stack_fffffffffffffeb8._M_mask,
                   (ValueRelations *)in_stack_fffffffffffffeb8._M_p,in_stack_fffffffffffffeb0);
      std::tie<unsigned_int,dg::vr::AllocatedArea_const*>
                (&in_stack_fffffffffffffe38->first,(AllocatedArea **)this_00);
      std::tuple<unsigned_int&,dg::vr::AllocatedArea_const*&>::operator=
                ((tuple<unsigned_int_&,_const_dg::vr::AllocatedArea_*&> *)
                 CONCAT44(AVar3,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38);
      if (local_38 == 0) {
        llvm::CallBase::getOperand(this_00,in_stack_fffffffffffffe2c);
        bVar1 = llvm::isa<llvm::ConstantPointerNull,llvm::Value*>((Value **)0x1efe3f);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          invalidateHeapAllocatedAreas
                    (in_stack_fffffffffffffe70,(vector<bool,_std::allocator<bool>_> *)ptr);
        }
      }
      else {
        std::vector<bool,_std::allocator<bool>_>::operator[]
                  (in_RDI,(size_type)in_stack_fffffffffffffe48);
        std::_Bit_reference::operator=((_Bit_reference *)&local_1a0,false);
      }
    }
    AnalysisOptions::~AnalysisOptions((AnalysisOptions *)0x1efe6a);
  }
  return;
}

Assistant:

void StructureAnalyzer::setValidAreasByInstruction(
        VRLocation &location, std::vector<bool> &validAreas,
        VRInstruction *vrinst) const {
    const llvm::Instruction *inst = vrinst->getInstruction();
    unsigned index = 0;
    const AllocatedArea *area = nullptr;

    // every memory allocated on stack is considered allocated successfully
    if (llvm::isa<llvm::AllocaInst>(inst)) {
        std::tie(index, area) = getAllocatedAreaFor(inst);
        assert(area);
        validAreas[index] = true;
    }

    // if came across lifetime_end call, then mark memory whose scope ended
    // invalid
    if (const auto *intrinsic = llvm::dyn_cast<llvm::IntrinsicInst>(inst)) {
        if (intrinsic->getIntrinsicID() == llvm::Intrinsic::lifetime_end) {
            std::tie(index, area) =
                    getEqualArea(location.relations, intrinsic->getOperand(1));
            assert(area);
            validAreas[index] = false;
        }
    }

    if (const auto *call = llvm::dyn_cast<llvm::CallInst>(inst)) {
        auto *function = call->getCalledFunction();

        if (!function)
            return;

        AnalysisOptions options;
        if (options.getAllocationFunction(function->getName().str()) ==
            AllocationFunction::REALLOC) {
            // if realloc of memory occured, the reallocated memory cannot
            // be considered valid until the realloc is proven unsuccessful
            std::tie(index, area) =
                    getEqualArea(location.relations, call->getOperand(0));
            if (area)
                validAreas[index] = false;
            else if (!llvm::isa<llvm::ConstantPointerNull>(
                             call->getOperand(0))) {
                // else we do not know which area has been reallocated and
                // thus possibly invalidated, so it may have been any of
                // them
                invalidateHeapAllocatedAreas(validAreas);
            }
        }

        if (function->getName().equals("free")) {
            // if free occures, the freed memory cannot be considered valid
            // anymore
            std::tie(index, area) =
                    getEqualArea(location.relations, call->getOperand(0));

            if (area)
                validAreas[index] = false;
            else if (!llvm::isa<llvm::ConstantPointerNull>(
                             call->getOperand(0))) {
                // else we do not know which area has been freed, so it may
                // have been any of them
                invalidateHeapAllocatedAreas(validAreas);
            }
        }
    }
}